

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::IODeclaration::checkDataTypesValid<soul::CodeLocation&>
          (IODeclaration *this,CodeLocation *errorLocation)

{
  size_t sVar1;
  CodeLocation *pCVar2;
  bool bVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  reference pvVar5;
  reference other;
  string local_1c8;
  string local_1a8;
  CompileMessage local_188;
  ulong local_150;
  size_t j;
  size_t i;
  reference local_108;
  Type *dataType_1;
  iterator __end3;
  iterator __begin3;
  vector<soul::Type,_std::allocator<soul::Type>_> *__range3;
  CompileMessage local_b0;
  undefined1 local_78 [8];
  value_type dataType;
  CompileMessage local_50;
  CodeLocation *local_18;
  CodeLocation *errorLocation_local;
  IODeclaration *this_local;
  
  local_18 = errorLocation;
  errorLocation_local = (CodeLocation *)this;
  bVar3 = isStreamEndpoint(this);
  if (bVar3) {
    sVar4 = std::vector<soul::Type,_std::allocator<soul::Type>_>::size(&this->dataTypes);
    pCVar2 = local_18;
    if (sVar4 != 1) {
      Errors::noMultipleTypesOnEndpoint<>();
      CodeLocation::throwError(pCVar2,&local_50);
    }
    pvVar5 = std::vector<soul::Type,_std::allocator<soul::Type>_>::front(&this->dataTypes);
    Type::Type((Type *)local_78,pvVar5);
    bVar3 = Type::isPrimitiveOrVector((Type *)local_78);
    pCVar2 = local_18;
    if (!bVar3) {
      Errors::illegalTypeForEndpoint<>();
      CodeLocation::throwError(pCVar2,&local_b0);
    }
    bVar3 = Type::isVoid((Type *)local_78);
    pCVar2 = local_18;
    if (bVar3) {
      Errors::voidCannotBeUsedForEndpoint<>();
      CodeLocation::throwError(pCVar2,(CompileMessage *)&__range3);
    }
    Type::~Type((Type *)local_78);
  }
  __end3 = std::vector<soul::Type,_std::allocator<soul::Type>_>::begin(&this->dataTypes);
  dataType_1 = (Type *)std::vector<soul::Type,_std::allocator<soul::Type>_>::end(&this->dataTypes);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
                                *)&dataType_1);
    if (!bVar3) {
      j = 1;
      do {
        sVar1 = j;
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::vector<soul::Type,_std::allocator<soul::Type>_>::size(&this->dataTypes);
        if (args_1 <= sVar1) {
          return;
        }
        for (local_150 = 0; local_150 < j; local_150 = local_150 + 1) {
          pvVar5 = std::vector<soul::Type,_std::allocator<soul::Type>_>::operator[]
                             (&this->dataTypes,j);
          other = std::vector<soul::Type,_std::allocator<soul::Type>_>::operator[]
                            (&this->dataTypes,local_150);
          bVar3 = Type::isEqual(pvVar5,other,4);
          pCVar2 = local_18;
          if (bVar3) {
            pvVar5 = std::vector<soul::Type,_std::allocator<soul::Type>_>::operator[]
                               (&this->dataTypes,local_150);
            Type::getDescription_abi_cxx11_(&local_1a8,pvVar5);
            pvVar5 = std::vector<soul::Type,_std::allocator<soul::Type>_>::operator[]
                               (&this->dataTypes,j);
            Type::getDescription_abi_cxx11_(&local_1c8,pvVar5);
            Errors::duplicateTypesInList<std::__cxx11::string,std::__cxx11::string>
                      (&local_188,(Errors *)&local_1a8,&local_1c8,args_1);
            CodeLocation::throwError(pCVar2,&local_188);
          }
        }
        j = j + 1;
      } while( true );
    }
    local_108 = __gnu_cxx::
                __normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
                ::operator*(&__end3);
    bVar3 = Type::isVoid(local_108);
    pCVar2 = local_18;
    if (bVar3) break;
    __gnu_cxx::
    __normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>::
    operator++(&__end3);
  }
  Errors::voidCannotBeUsedForEndpoint<>();
  CodeLocation::throwError(pCVar2,(CompileMessage *)&i);
}

Assistant:

void checkDataTypesValid (Thrower&& errorLocation)
        {
            if (isStreamEndpoint())
            {
                if (dataTypes.size() != 1)
                    errorLocation.throwError (Errors::noMultipleTypesOnEndpoint());

                auto dataType = dataTypes.front();

                if (! dataType.isPrimitiveOrVector())
                    errorLocation.throwError (Errors::illegalTypeForEndpoint());

                if (dataType.isVoid())
                    errorLocation.throwError (Errors::voidCannotBeUsedForEndpoint());
            }

            for (auto& dataType : dataTypes)
                if (dataType.isVoid())
                    errorLocation.throwError (Errors::voidCannotBeUsedForEndpoint());

            for (size_t i = 1; i < dataTypes.size(); ++i)
                for (size_t j = 0; j < i; ++j)
                    if (dataTypes[i].isEqual (dataTypes[j], Type::ignoreVectorSize1))
                        errorLocation.throwError (Errors::duplicateTypesInList (dataTypes[j].getDescription(),
                                                                                dataTypes[i].getDescription()));
        }